

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

UChar32 ucnv_MBCSGetNextUChar(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  byte bVar1;
  uint8_t uVar2;
  uint uVar3;
  UConverter *pUVar4;
  UConverterSharedData *pUVar5;
  byte *pbVar6;
  int32_t (*stateTable) [256];
  uint16_t *puVar7;
  long lVar8;
  uint uVar9;
  UBool UVar10;
  char cVar11;
  uint8_t *puVar12;
  byte *pbVar13;
  long lVar14;
  byte state;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint32_t uVar18;
  uint uVar19;
  long lVar20;
  byte *pbVar21;
  bool bVar22;
  
  pUVar4 = pArgs->converter;
  if ('\0' < pUVar4->preToULength) {
    return -9;
  }
  pUVar5 = pUVar4->sharedData;
  if (((pUVar5->mbcs).unicodeMask & 2) != 0) {
    return -9;
  }
  pbVar6 = (byte *)pArgs->sourceLimit;
  if ((pUVar5->mbcs).countStates != '\x01') {
    uVar17 = pUVar4->mode;
    if ((char)uVar17 == '\0') {
      uVar17 = (uint)(pUVar5->mbcs).dbcsOnlyState;
    }
    stateTable = *(int32_t (**) [256])
                  ((pUVar5->mbcs).sbcsIndex +
                  (ulong)(((byte)pUVar4->options & 0x10) >> 4) * 4 + -0x18);
    puVar7 = (pUVar5->mbcs).unicodeCodeUnits;
    uVar18 = pUVar4->toUnicodeStatus;
    uVar16 = 0xffffffff;
    pbVar13 = (byte *)pArgs->source;
switchD_002c7155_caseD_3:
    pbVar21 = pbVar13;
    if (pbVar6 <= pbVar21) {
      lVar20 = 0;
      goto LAB_002c726a;
    }
    lVar20 = (long)pbVar6 - (long)pbVar21;
    lVar14 = 1;
    uVar15 = uVar17;
    while( true ) {
      pbVar13 = pbVar21 + lVar14;
      uVar3 = *(uint *)((long)*stateTable +
                       (ulong)pbVar21[lVar14 + -1] * 4 + (ulong)((uVar15 & 0xff) << 10));
      if ((int)uVar3 < 0) break;
      uVar17 = uVar3 >> 0x18;
      uVar18 = (uVar3 & 0xffffff) + uVar18;
      if (((pbVar13 < pbVar6) &&
          (uVar15 = *(uint *)((long)*stateTable + (ulong)*pbVar13 * 4 + (ulong)(uVar17 << 10)),
          (uVar15 & 0x80f00000) == 0x80400000)) &&
         (uVar16 = (uint)puVar7[(uVar15 & 0xffff) + uVar18],
         puVar7[(uVar15 & 0xffff) + uVar18] < 0xfffe)) {
        uVar17 = (uint)((byte)(uVar15 >> 0x18) & 0x7f);
        lVar20 = lVar14 + 1;
        goto LAB_002c726a;
      }
      lVar8 = lVar14 - (long)pbVar6;
      lVar14 = lVar14 + 1;
      uVar15 = uVar17;
      if (pbVar21 + lVar8 == (byte *)0x0) goto LAB_002c726a;
    }
    pUVar4->mode = uVar15 & 0xff;
    state = (byte)(uVar3 >> 0x18) & 0x7f;
    uVar17 = (uint)state;
    uVar19 = uVar3 >> 0x14 & 0xf;
    if (uVar19 == 5) {
      uVar16 = (uint)puVar7[(uVar3 & 0xffff) + uVar18];
      if (0xd7ff < uVar16) {
        uVar15 = (uVar3 & 0xffff) + uVar18 + 1;
        if (uVar16 < 0xe000) {
          uVar16 = (uVar16 & 0x3ff) * 0x400 + (uint)puVar7[uVar15] + 0x2400;
        }
        else {
          if ((uVar16 & 0xfffffffe) != 0xe000) {
            uVar9 = uVar16;
            if (uVar16 == 0xffff) {
              uVar16 = 0xffff;
              uVar15 = uVar17;
              goto LAB_002c737b;
            }
            goto LAB_002c7384;
          }
          uVar16 = (uint)puVar7[uVar15];
        }
      }
    }
    else {
      lVar20 = lVar14;
      if (uVar19 != 4) {
        if (uVar19 != 0) {
          if ((uVar3 & 0xd00000) != 0x100000) goto code_r0x002c7136;
          uVar16 = (uVar3 & 0xfffff) + 0x10000;
          goto LAB_002c726a;
        }
        uVar16 = uVar3 & 0xffff;
        goto LAB_002c7273;
      }
      uVar15 = (uVar3 & 0xffff) + uVar18;
      uVar16 = (uint)puVar7[uVar15];
      bVar22 = uVar16 != 0xfffe;
      if (uVar16 < 0xfffe) goto LAB_002c726a;
      uVar16 = 0xffff;
      if (bVar22) goto switchD_002c7155_caseD_7;
      uVar16 = ucnv_MBCSGetFallback(&pUVar5->mbcs,uVar15);
      uVar9 = 0xfffe;
      if (uVar16 == 0xfffe) goto LAB_002c7384;
    }
    goto LAB_002c7273;
  }
  lVar20 = *(long *)((pUVar5->mbcs).sbcsIndex +
                    (ulong)(((byte)pUVar4->options & 0x10) >> 4) * 4 + -0x18);
  pbVar13 = (byte *)pArgs->source;
  do {
    if (pbVar6 <= pbVar13) goto LAB_002c7198;
    uVar17 = *(uint *)(lVar20 + (ulong)*pbVar13 * 4);
    pArgs->source = (char *)(pbVar13 + 1);
    if ((int)uVar17 < -0x7ff00000) break;
    if ((uVar17 & 0xd00000) == 0x100000) {
      return (uVar17 & 0xfffff) + 0x10000;
    }
    uVar16 = uVar17 >> 0x14 & 0xf;
    if (uVar16 == 7) {
      *pErrorCode = U_ILLEGAL_CHAR_FOUND;
LAB_002c7193:
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        pArgs->source = (char *)pbVar13;
        return -9;
      }
LAB_002c7198:
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0xffff;
    }
    if (uVar16 == 6) goto LAB_002c7193;
    pbVar13 = pbVar13 + 1;
  } while (uVar16 != 2);
  return uVar17 & 0xffff;
code_r0x002c7136:
  uVar18 = 0;
  uVar9 = uVar16;
  switch(uVar19) {
  case 2:
    goto switchD_002c7155_caseD_2;
  default:
    goto switchD_002c7155_caseD_3;
  case 6:
    goto LAB_002c7384;
  case 7:
switchD_002c7155_caseD_7:
    uVar15 = uVar17;
    break;
  case 8:
    if ((pUVar5->mbcs).dbcsOnlyState == '\0') goto LAB_002c7384;
  }
LAB_002c737b:
  *pErrorCode = U_ILLEGAL_CHAR_FOUND;
  uVar9 = uVar16;
  uVar17 = uVar15;
LAB_002c7384:
  uVar16 = uVar9;
  state = (byte)uVar17;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar4->toUnicodeStatus = 0;
    pUVar4->mode = uVar17 & 0xff;
    pArgs->source = (char *)pbVar21;
    return -9;
  }
  goto LAB_002c7273;
switchD_002c7155_caseD_2:
  uVar16 = uVar3 & 0xffff;
LAB_002c726a:
  state = (byte)uVar17;
  lVar14 = lVar20;
LAB_002c7273:
  pbVar13 = pbVar21 + lVar14;
  if ((int)uVar16 < 0) {
    if (((*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) && (pbVar13 == pbVar6)) && (0 < lVar14)) {
      puVar12 = pUVar4->toUBytes;
      pUVar4->toULength = (int8_t)lVar14;
      do {
        bVar1 = *pbVar21;
        pbVar21 = pbVar21 + 1;
        *puVar12 = bVar1;
        puVar12 = puVar12 + 1;
      } while (pbVar21 < pbVar13);
      *pErrorCode = U_TRUNCATED_CHAR_FOUND;
    }
    else if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      uVar2 = (pUVar5->mbcs).dbcsOnlyState;
      pUVar4->toUBytes[0] = *pbVar21;
      if (lVar14 != 1) {
        pbVar21 = pbVar21 + 1;
        cVar11 = '\x01';
        if (1 < lVar14) {
          lVar20 = 0;
          do {
            bVar1 = pbVar21[lVar20];
            UVar10 = isSingleOrLead(stateTable,state,uVar2 != '\0',bVar1);
            cVar11 = (char)lVar20;
            if (UVar10 != '\0') {
              cVar11 = cVar11 + '\x01';
              pbVar21 = pbVar21 + lVar20;
              goto LAB_002c73b9;
            }
            pUVar4->toUBytes[lVar20 + 1] = bVar1;
            lVar14 = lVar20 + 1;
            lVar20 = lVar20 + 1;
          } while (pbVar21 + lVar14 < pbVar13);
          cVar11 = cVar11 + '\x02';
          pbVar21 = pbVar21 + lVar20;
        }
LAB_002c73b9:
        pbVar13 = pbVar21;
        pUVar4->toULength = cVar11;
        uVar16 = 0xffff;
        goto LAB_002c72e4;
      }
      pUVar4->toULength = '\x01';
    }
    uVar16 = 0xffff;
  }
LAB_002c72e4:
  pUVar4->toUnicodeStatus = 0;
  pUVar4->mode = (uint)state;
  pArgs->source = (char *)pbVar13;
  return uVar16;
}

Assistant:

static UChar32 U_CALLCONV
ucnv_MBCSGetNextUChar(UConverterToUnicodeArgs *pArgs,
                  UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit, *lastSource;

    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state;

    int32_t entry;
    UChar32 c;
    uint8_t action;

    /* use optimized function if possible */
    cnv=pArgs->converter;

    if(cnv->preToULength>0) {
        /* use the generic code in ucnv_getNextUChar() to continue with a partial match */
        return UCNV_GET_NEXT_UCHAR_USE_TO_U;
    }

    if(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SURROGATES) {
        /*
         * Using the generic ucnv_getNextUChar() code lets us deal correctly
         * with the rare case of a codepage that maps single surrogates
         * without adding the complexity to this already complicated function here.
         */
        return UCNV_GET_NEXT_UCHAR_USE_TO_U;
    } else if(cnv->sharedData->mbcs.countStates==1) {
        return ucnv_MBCSSingleGetNextUChar(pArgs, pErrorCode);
    }

    /* set up the local pointers */
    source=lastSource=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }
    unicodeCodeUnits=cnv->sharedData->mbcs.unicodeCodeUnits;

    /* get the converter state from UConverter */
    offset=cnv->toUnicodeStatus;

    /*
     * if we are in the SBCS state for a DBCS-only converter,
     * then load the DBCS state from the MBCS data
     * (dbcsOnlyState==0 if it is not a DBCS-only converter)
     */
    if((state=(uint8_t)(cnv->mode))==0) {
        state=cnv->sharedData->mbcs.dbcsOnlyState;
    }

    /* conversion loop */
    c=U_SENTINEL;
    while(source<sourceLimit) {
        entry=stateTable[state][*source++];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);

            /* optimization for 1/2-byte input and BMP output */
            if( source<sourceLimit &&
                MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
            ) {
                ++source;
                state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                /* output BMP code point */
                break;
            }
        } else {
            /* save the previous state for proper extension mapping with SI/SO-stateful converters */
            cnv->mode=state;

            /* set the next state early so that we can reuse the entry variable */
            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */

            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
            if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                break;
            } else if(action==MBCS_STATE_VALID_16) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset];
                if(c<0xfffe) {
                    /* output BMP code point */
                    break;
                } else if(c==0xfffe) {
                    if(UCNV_TO_U_USE_FALLBACK(cnv) && (c=ucnv_MBCSGetFallback(&cnv->sharedData->mbcs, offset))!=0xfffe) {
                        break;
                    }
                } else {
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                    break;
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=((c&0x3ff)<<10)+unicodeCodeUnits[offset]+(0x10000-0xdc00);
                    break;
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[offset];
                    break;
                } else if(c==0xffff) {
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_VALID_DIRECT_20 ||
                      (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
            ) {
                /* output supplementary code point */
                c=(UChar32)(MBCS_ENTRY_FINAL_VALUE(entry)+0x10000);
                break;
            } else if(action==MBCS_STATE_CHANGE_ONLY) {
                /*
                 * This serves as a state change without any output.
                 * It is useful for reading simple stateful encodings,
                 * for example using just Shift-In/Shift-Out codes.
                 * The 21 unused bits may later be used for more sophisticated
                 * state transitions.
                 */
                if(cnv->sharedData->mbcs.dbcsOnlyState!=0) {
                    /* SI/SO are illegal for DBCS-only conversion */
                    state=(uint8_t)(cnv->mode); /* restore the previous state */

                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
                if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                    /* output BMP code point */
                    c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                    break;
                }
            } else if(action==MBCS_STATE_UNASSIGNED) {
                /* just fall through */
            } else if(action==MBCS_STATE_ILLEGAL) {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            } else {
                /* reserved (must never occur), or only state change */
                offset=0;
                lastSource=source;
                continue;
            }

            /* end of action codes: prepare for a new character */
            offset=0;

            if(U_FAILURE(*pErrorCode)) {
                /* callback(illegal) */
                break;
            } else /* unassigned sequence */ {
                /* defer to the generic implementation */
                cnv->toUnicodeStatus=0;
                cnv->mode=state;
                pArgs->source=(const char *)lastSource;
                return UCNV_GET_NEXT_UCHAR_USE_TO_U;
            }
        }
    }

    if(c<0) {
        if(U_SUCCESS(*pErrorCode) && source==sourceLimit && lastSource<source) {
            /* incomplete character byte sequence */
            uint8_t *bytes=cnv->toUBytes;
            cnv->toULength=(int8_t)(source-lastSource);
            do {
                *bytes++=*lastSource++;
            } while(lastSource<source);
            *pErrorCode=U_TRUNCATED_CHAR_FOUND;
        } else if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            /*
             * Ticket 5691: consistent illegal sequences:
             * - We include at least the first byte in the illegal sequence.
             * - If any of the non-initial bytes could be the start of a character,
             *   we stop the illegal sequence before the first one of those.
             */
            UBool isDBCSOnly=(UBool)(cnv->sharedData->mbcs.dbcsOnlyState!=0);
            uint8_t *bytes=cnv->toUBytes;
            *bytes++=*lastSource++;     /* first byte */
            if(lastSource==source) {
                cnv->toULength=1;
            } else /* lastSource<source: multi-byte character */ {
                int8_t i;
                for(i=1;
                    lastSource<source && !isSingleOrLead(stateTable, state, isDBCSOnly, *lastSource);
                    ++i
                ) {
                    *bytes++=*lastSource++;
                }
                cnv->toULength=i;
                source=lastSource;
            }
        } else {
            /* no output because of empty input or only state changes */
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        }
        c=0xffff;
    }

    /* set the converter state back into UConverter, ready for a new character */
    cnv->toUnicodeStatus=0;
    cnv->mode=state;

    /* write back the updated pointer */
    pArgs->source=(const char *)source;
    return c;
}